

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex2-server.c
# Opt level: O3

strbuf * finalise_and_sign_exhash(ssh2_transport_state *s)

{
  strbuf *psVar1;
  ptrlen pVar2;
  
  ssh2transport_finalise_exhash(s);
  psVar1 = strbuf_new();
  pVar2.len = s->kex_alg->hash->hlen;
  pVar2.ptr = s->exchange_hash;
  (*s->hkey->vt->sign)(s->hkey,pVar2,s->hkflags,psVar1->binarysink_);
  return psVar1;
}

Assistant:

static strbuf *finalise_and_sign_exhash(struct ssh2_transport_state *s)
{
    strbuf *sb;
    ssh2transport_finalise_exhash(s);
    sb = strbuf_new();
    ssh_key_sign(
        s->hkey, make_ptrlen(s->exchange_hash, s->kex_alg->hash->hlen),
        s->hkflags, BinarySink_UPCAST(sb));
    return sb;
}